

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O2

void printf_btr_at91(can_bittiming *bt,_Bool hdr)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,hdr) != 0) {
    printf("%10s","CAN_BR");
    return;
  }
  printf("0x%08x",(ulong)(bt->brp * 0x10000 - 0x10000 |
                         bt->sjw * 0x1000 - 0x1000 | bt->prop_seg * 0x100 - 0x100 |
                         bt->phase_seg1 * 0x10 - 0x10 | bt->phase_seg2 - 1));
  return;
}

Assistant:

static void printf_btr_at91(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "CAN_BR");
	} else {
		uint32_t br = ((bt->phase_seg2 - 1) |
			       ((bt->phase_seg1 - 1) << 4) |
			       ((bt->prop_seg - 1) << 8) |
			       ((bt->sjw - 1) << 12) |
			       ((bt->brp - 1) << 16));
		printf("0x%08x", br);
	}
}